

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::StorageBufferBindInfo::BindResource
          (StorageBufferBindInfo *this,BindResourceInfo *BindInfo)

{
  Uint32 ArrayIndex;
  ShaderResourceCacheGL *this_00;
  PIPELINE_RESOURCE_FLAGS PVar1;
  PipelineResourceDesc *ResDesc;
  Char *pCVar2;
  CachedSSBO *this_01;
  BufferViewGLImpl *pBVar3;
  BufferViewGLImpl *pBVar4;
  PipelineResourceSignatureDesc *pPVar5;
  PipelineResourceDesc *Args_1;
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  char *in_stack_fffffffffffffee0;
  undefined1 local_c8 [8];
  string msg_2;
  CachedSSBO *CachedSSBO;
  RefCntAutoPtr<Diligent::BufferViewGLImpl> pViewGL;
  string msg_1;
  ShaderResourceCacheType *ResourceCache;
  undefined1 local_48 [8];
  string msg;
  ResourceAttribs *Attr;
  PipelineResourceDesc *Desc;
  BindResourceInfo *BindInfo_local;
  StorageBufferBindInfo *this_local;
  
  ResDesc = ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       *)this);
  msg.field_2._8_8_ =
       GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>::GetAttribs
                 (&this->
                   super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>);
  Args_1 = ResDesc;
  if (ResDesc->ArraySize <= BindInfo->ArrayIndex) {
    FormatString<char[89]>
              ((string *)local_48,
               (char (*) [89])
               "Index is out of range, but it should\'ve been corrected by ShaderVariableBase::SetArray()"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (PipelineResourceDesc *)0x15e;
    DebugAssertionFailed
              (pCVar2,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x15e);
    std::__cxx11::string::~string((string *)local_48);
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>)
              .
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  if ((ResDesc->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV) &&
     (ResDesc->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
    FormatString<char[26],char[109]>
              ((string *)&pViewGL,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV"
               ,(char (*) [109])Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x161);
    std::__cxx11::string::~string((string *)&pViewGL);
  }
  RefCntAutoPtr<Diligent::BufferViewGLImpl>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedSSBO,
             &BindInfo->pObject->super_IObject,(INTERFACE_ID *)IID_BufferViewGL);
  this_01 = ShaderResourceCacheGL::GetConstSSBO
                      (this_00,*(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex);
  pBVar3 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr
                     ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedSSBO);
  msg_2.field_2._M_local_buf[0xe] = '\x01';
  msg_2.field_2._M_local_buf[0xf] = '\x02';
  pBVar4 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr(&this_01->pBufferView);
  pPVar5 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                      *)(((this->
                          super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                          ).
                          super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                         .m_ParentManager)->
                        super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                        m_pSignature);
  ExpectedViewTypes._M_len = 1;
  ExpectedViewTypes._M_array = (iterator)0x2;
  VerifyResourceViewBinding<Diligent::BufferViewGLImpl,Diligent::BUFFER_VIEW_TYPE>
            ((Diligent *)ResDesc,(PipelineResourceDesc *)BindInfo,(BindResourceInfo *)pBVar3,
             (BufferViewGLImpl *)((long)&msg_2.field_2 + 0xe),ExpectedViewTypes,
             RESOURCE_DIM_UNDEFINED,SUB81(pBVar4,0),
             (IDeviceObject *)(pPVar5->super_DeviceObjectAttribs).Name,in_stack_fffffffffffffee0);
  PVar1 = Diligent::operator&(ResDesc->Flags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
  if (PVar1 != PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[90]>
              ((string *)local_c8,
               (char (*) [90])
               "FORMATTED_BUFFER resource flag is set for a storage buffer - this should\'ve not happened."
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"BindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x171);
    std::__cxx11::string::~string((string *)local_c8);
  }
  ArrayIndex = BindInfo->ArrayIndex;
  pBVar3 = RefCntAutoPtr<Diligent::BufferViewGLImpl>::RawPtr
                     ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedSSBO);
  ValidateBufferMode<Diligent::BufferViewGLImpl>(ResDesc,ArrayIndex,pBVar3);
  ShaderResourceCacheGL::SetSSBO
            (this_00,*(int *)msg.field_2._8_8_ + BindInfo->ArrayIndex,
             (RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedSSBO);
  RefCntAutoPtr<Diligent::BufferViewGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::BufferViewGLImpl> *)&CachedSSBO);
  return;
}

Assistant:

void ShaderVariableManagerGL::StorageBufferBindInfo::BindResource(const BindResourceInfo& BindInfo)
{
    const auto& Desc = GetDesc();
    const auto& Attr = GetAttribs();

    VERIFY(BindInfo.ArrayIndex < Desc.ArraySize, "Index is out of range, but it should've been corrected by ShaderVariableBase::SetArray()");
    auto& ResourceCache = m_ParentManager.m_ResourceCache;
    VERIFY_EXPR(Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV ||
                Desc.ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV);

    // We cannot use ClassPtrCast<> here as the resource can be of wrong type
    RefCntAutoPtr<BufferViewGLImpl> pViewGL{BindInfo.pObject, IID_BufferViewGL};
#ifdef DILIGENT_DEVELOPMENT
    {
        auto& CachedSSBO = ResourceCache.GetConstSSBO(Attr.CacheOffset + BindInfo.ArrayIndex);
        // HLSL structured buffers are mapped to SSBOs in GLSL
        VerifyResourceViewBinding(Desc, BindInfo, pViewGL.RawPtr(),
                                  {BUFFER_VIEW_SHADER_RESOURCE, BUFFER_VIEW_UNORDERED_ACCESS}, // Expected view types
                                  RESOURCE_DIM_BUFFER,                                         // Expected resource dimension
                                  false,                                                       // IsMultisample (ignored when resource dim is buffer)
                                  CachedSSBO.pBufferView.RawPtr(),
                                  m_ParentManager.m_pSignature->GetDesc().Name);

        VERIFY((Desc.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == 0,
               "FORMATTED_BUFFER resource flag is set for a storage buffer - this should've not happened.");
        ValidateBufferMode(Desc, BindInfo.ArrayIndex, pViewGL.RawPtr());
    }
#endif
    ResourceCache.SetSSBO(Attr.CacheOffset + BindInfo.ArrayIndex, std::move(pViewGL));
}